

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderIndexingTests.cpp
# Opt level: O0

MovePtr<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
* vkt::sr::anon_unknown_0::createTmpArrayCase
            (MovePtr<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
             *__return_storage_ptr__,TestContext *context,string *caseName,string *description,
            bool isVertexCase,DataType varType,IndexAccessType writeAccess,
            IndexAccessType readAccess)

{
  ShaderIndexingCase *this;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_basic_string<char>_>_>::value,_pair<iterator,_bool>_>
  _Var1;
  ostringstream *local_688;
  DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase> local_669;
  ShaderEvalFunc local_668;
  ShaderEvalFunc evalFunc;
  string fragmentShaderSource;
  string vertexShaderSource;
  undefined1 local_600 [8];
  StringTemplate fragTemplate;
  undefined1 local_5c0 [8];
  StringTemplate vertTemplate;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_590;
  _Base_ptr local_550;
  undefined1 local_548;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_540;
  _Base_ptr local_500;
  undefined1 local_4f8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4f0;
  _Base_ptr local_4b0;
  undefined1 local_4a8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4a0;
  _Base_ptr local_460;
  undefined1 local_458;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_450;
  _Base_ptr local_410;
  undefined1 local_408;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_400;
  _Base_ptr local_3c0;
  undefined1 local_3b8;
  char *local_3b0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3a8;
  undefined1 local_368 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  ostringstream *op;
  ostringstream local_320 [8];
  ostringstream frag;
  ostringstream local_1a8 [8];
  ostringstream vtx;
  DataType varType_local;
  bool isVertexCase_local;
  string *description_local;
  string *caseName_local;
  TestContext *context_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__cxx11::ostringstream::ostringstream(local_320);
  if (isVertexCase) {
    local_688 = local_1a8;
  }
  else {
    local_688 = local_320;
  }
  params._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_688;
  std::operator<<((ostream *)local_1a8,"#version 310 es\n");
  std::operator<<((ostream *)local_320,"#version 310 es\n");
  std::operator<<((ostream *)local_1a8,"layout(location = 0) in highp vec4 a_position;\n");
  std::operator<<((ostream *)local_1a8,"layout(location = 1) in highp vec4 a_coords;\n");
  std::operator<<((ostream *)local_320,"layout(location = 0) out mediump vec4 o_color;\n");
  if (isVertexCase) {
    std::operator<<((ostream *)local_1a8,"layout(location = 0) out mediump vec4 v_color;\n");
    std::operator<<((ostream *)local_320,"layout(location = 0) in mediump vec4 v_color;\n");
  }
  else {
    std::operator<<((ostream *)local_1a8,"layout(location = 0) out mediump vec4 v_coords;\n");
    std::operator<<((ostream *)local_320,"layout(location = 0) in mediump vec4 v_coords;\n");
  }
  if ((writeAccess == INDEXACCESS_DYNAMIC) || (readAccess == INDEXACCESS_DYNAMIC)) {
    std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "layout(std140, binding = 0) uniform something0 { mediump int ui_zero; };\n");
    std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "layout(std140, binding = 1) uniform something1 { mediump int ui_one; };\n");
    std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "layout(std140, binding = 2) uniform something2 { mediump int ui_two; };\n");
    std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "layout(std140, binding = 3) uniform something3 { mediump int ui_three; };\n");
  }
  if ((writeAccess == INDEXACCESS_DYNAMIC_LOOP) || (readAccess == INDEXACCESS_DYNAMIC_LOOP)) {
    std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "layout(std140, binding = 4) uniform something4 { mediump int ui_four; };\n");
  }
  std::operator<<((ostream *)local_1a8,"\n");
  std::operator<<((ostream *)local_1a8,"void main()\n");
  std::operator<<((ostream *)local_1a8,"{\n");
  std::operator<<((ostream *)local_1a8,"\tgl_Position = a_position;\n");
  std::operator<<((ostream *)local_320,"\n");
  std::operator<<((ostream *)local_320,"void main()\n");
  std::operator<<((ostream *)local_320,"{\n");
  if (isVertexCase) {
    std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "\t${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(a_coords);\n");
  }
  else {
    std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "\t${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(v_coords);\n");
  }
  std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                  "\t${PRECISION} ${VAR_TYPE} arr[${ARRAY_LEN}];\n");
  if (writeAccess == INDEXACCESS_STATIC) {
    std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "\tarr[0] = ${VAR_TYPE}(coords);\n");
    std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "\tarr[1] = ${VAR_TYPE}(coords) * 0.5;\n");
    std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "\tarr[2] = ${VAR_TYPE}(coords) * 0.25;\n");
    std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "\tarr[3] = ${VAR_TYPE}(coords) * 0.125;\n");
  }
  else if (writeAccess == INDEXACCESS_DYNAMIC) {
    std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "\tarr[ui_zero]  = ${VAR_TYPE}(coords);\n");
    std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "\tarr[ui_one]   = ${VAR_TYPE}(coords) * 0.5;\n");
    std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "\tarr[ui_two]   = ${VAR_TYPE}(coords) * 0.25;\n");
    std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "\tarr[ui_three] = ${VAR_TYPE}(coords) * 0.125;\n");
  }
  else if (writeAccess == INDEXACCESS_STATIC_LOOP) {
    std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "\tfor (int i = 0; i < 4; i++)\n");
    std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,"\t{\n");
    std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "\t\tarr[i] = ${VAR_TYPE}(coords);\n");
    std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "\t\tcoords = coords * 0.5;\n");
    std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,"\t}\n");
  }
  else {
    std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "\tfor (int i = 0; i < ui_four; i++)\n");
    std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,"\t{\n");
    std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "\t\tarr[i] = ${VAR_TYPE}(coords);\n");
    std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "\t\tcoords = coords * 0.5;\n");
    std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,"\t}\n");
  }
  std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                  "\t${PRECISION} ${VAR_TYPE} res = ${VAR_TYPE}(0.0);\n");
  if (readAccess == INDEXACCESS_STATIC) {
    std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "\tres += arr[0];\n");
    std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "\tres += arr[1];\n");
    std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "\tres += arr[2];\n");
    std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "\tres += arr[3];\n");
  }
  else if (readAccess == INDEXACCESS_DYNAMIC) {
    std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "\tres += arr[ui_zero];\n");
    std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "\tres += arr[ui_one];\n");
    std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "\tres += arr[ui_two];\n");
    std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "\tres += arr[ui_three];\n");
  }
  else if (readAccess == INDEXACCESS_STATIC_LOOP) {
    std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "\tfor (int i = 0; i < 4; i++)\n");
    std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "\t\tres += arr[i];\n");
  }
  else {
    std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "\tfor (int i = 0; i < ui_four; i++)\n");
    std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "\t\tres += arr[i];\n");
  }
  if (isVertexCase) {
    std::operator<<((ostream *)local_1a8,"\tv_color = vec4(res${PADDING});\n");
    std::operator<<((ostream *)local_320,"\to_color = v_color;\n");
  }
  else {
    std::operator<<((ostream *)local_1a8,"\tv_coords = a_coords;\n");
    std::operator<<((ostream *)local_320,"\to_color = vec4(res${PADDING});\n");
  }
  std::operator<<((ostream *)local_1a8,"}\n");
  std::operator<<((ostream *)local_320,"}\n");
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_368);
  local_3b0 = glu::getDataTypeName(varType);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[9],_const_char_*,_true>(&local_3a8,(char (*) [9])0x1312ed5,&local_3b0);
  _Var1 = std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)local_368,&local_3a8);
  local_3c0 = (_Base_ptr)_Var1.first._M_node;
  local_3b8 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_3a8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[10],_const_char_(&)[2],_true>
            (&local_400,(char (*) [10])"ARRAY_LEN",(char (*) [2])0x1317748);
  _Var1 = std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)local_368,&local_400);
  local_410 = (_Base_ptr)_Var1.first._M_node;
  local_408 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_400);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
            (&local_450,(char (*) [10])0x1312ee6,(char (*) [8])0x134da22);
  _Var1 = std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)local_368,&local_450);
  local_460 = (_Base_ptr)_Var1.first._M_node;
  local_458 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_450);
  if (varType == TYPE_FLOAT) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[8],_const_char_(&)[16],_true>
              (&local_4a0,(char (*) [8])"PADDING",(char (*) [16])0x131b334);
    _Var1 = std::
            map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)local_368,&local_4a0);
    local_4b0 = (_Base_ptr)_Var1.first._M_node;
    local_4a8 = _Var1.second;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_4a0);
  }
  else if (varType == TYPE_FLOAT_VEC2) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
              (&local_4f0,(char (*) [8])"PADDING",(char (*) [11])0x131b2e3);
    _Var1 = std::
            map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)local_368,&local_4f0);
    local_500 = (_Base_ptr)_Var1.first._M_node;
    local_4f8 = _Var1.second;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_4f0);
  }
  else if (varType == TYPE_FLOAT_VEC3) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[8],_const_char_(&)[6],_true>
              (&local_540,(char (*) [8])"PADDING",(char (*) [6])0x131b2e8);
    _Var1 = std::
            map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)local_368,&local_540);
    local_550 = (_Base_ptr)_Var1.first._M_node;
    local_548 = _Var1.second;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_540);
  }
  else {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[8],_const_char_(&)[1],_true>
              (&local_590,(char (*) [8])"PADDING",(char (*) [1])0x12be863);
    _Var1 = std::
            map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)local_368,&local_590);
    vertTemplate.m_template.field_2._8_8_ = _Var1.first._M_node;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_590);
  }
  std::__cxx11::ostringstream::str();
  tcu::StringTemplate::StringTemplate
            ((StringTemplate *)local_5c0,(string *)((long)&fragTemplate.m_template.field_2 + 8));
  std::__cxx11::string::~string((string *)(fragTemplate.m_template.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::str();
  tcu::StringTemplate::StringTemplate
            ((StringTemplate *)local_600,(string *)((long)&vertexShaderSource.field_2 + 8));
  std::__cxx11::string::~string((string *)(vertexShaderSource.field_2._M_local_buf + 8));
  tcu::StringTemplate::specialize
            ((string *)((long)&fragmentShaderSource.field_2 + 8),(StringTemplate *)local_5c0,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_368);
  tcu::StringTemplate::specialize
            ((string *)&evalFunc,(StringTemplate *)local_600,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_368);
  local_668 = getArrayCoordsEvalFunc(varType);
  this = (ShaderIndexingCase *)operator_new(0xe0);
  ShaderIndexingCase::ShaderIndexingCase
            (this,context,caseName,description,isVertexCase,local_668,
             (string *)((long)&fragmentShaderSource.field_2 + 8),(string *)&evalFunc,varType,false);
  de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>::DefaultDeleter(&local_669)
  ;
  de::details::
  MovePtr<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
  ::MovePtr(__return_storage_ptr__,this);
  std::__cxx11::string::~string((string *)&evalFunc);
  std::__cxx11::string::~string((string *)(fragmentShaderSource.field_2._M_local_buf + 8));
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_600);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_5c0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_368);
  std::__cxx11::ostringstream::~ostringstream(local_320);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

static de::MovePtr<ShaderIndexingCase> createTmpArrayCase (tcu::TestContext&	context,
														const std::string&		caseName,
														const std::string&		description,
														bool					isVertexCase,
														DataType				varType,
														IndexAccessType			writeAccess,
														IndexAccessType			readAccess)
{
	std::ostringstream vtx;
	std::ostringstream frag;
	std::ostringstream& op = isVertexCase ? vtx : frag;

	vtx << "#version 310 es\n";
	frag << "#version 310 es\n";

	vtx << "layout(location = 0) in highp vec4 a_position;\n";
	vtx << "layout(location = 1) in highp vec4 a_coords;\n";
	frag << "layout(location = 0) out mediump vec4 o_color;\n";

	if (isVertexCase)
	{
		vtx << "layout(location = 0) out mediump vec4 v_color;\n";
		frag << "layout(location = 0) in mediump vec4 v_color;\n";
	}
	else
	{
		vtx << "layout(location = 0) out mediump vec4 v_coords;\n";
		frag << "layout(location = 0) in mediump vec4 v_coords;\n";
	}

	if (writeAccess == INDEXACCESS_DYNAMIC || readAccess == INDEXACCESS_DYNAMIC)
	{
		op << "layout(std140, binding = 0) uniform something0 { mediump int ui_zero; };\n";
		op << "layout(std140, binding = 1) uniform something1 { mediump int ui_one; };\n";
		op << "layout(std140, binding = 2) uniform something2 { mediump int ui_two; };\n";
		op << "layout(std140, binding = 3) uniform something3 { mediump int ui_three; };\n";
	}

	if (writeAccess == INDEXACCESS_DYNAMIC_LOOP || readAccess == INDEXACCESS_DYNAMIC_LOOP)
		op << "layout(std140, binding = 4) uniform something4 { mediump int ui_four; };\n";

	vtx << "\n";
	vtx << "void main()\n";
	vtx << "{\n";
	vtx << "	gl_Position = a_position;\n";

	frag << "\n";
	frag << "void main()\n";
	frag << "{\n";

	// Write array.
	if (isVertexCase)
		op << "	${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(a_coords);\n";
	else
		op << "	${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(v_coords);\n";

	op << "	${PRECISION} ${VAR_TYPE} arr[${ARRAY_LEN}];\n";
	if (writeAccess == INDEXACCESS_STATIC)
	{
		op << "	arr[0] = ${VAR_TYPE}(coords);\n";
		op << "	arr[1] = ${VAR_TYPE}(coords) * 0.5;\n";
		op << "	arr[2] = ${VAR_TYPE}(coords) * 0.25;\n";
		op << "	arr[3] = ${VAR_TYPE}(coords) * 0.125;\n";
	}
	else if (writeAccess == INDEXACCESS_DYNAMIC)
	{
		op << "	arr[ui_zero]  = ${VAR_TYPE}(coords);\n";
		op << "	arr[ui_one]   = ${VAR_TYPE}(coords) * 0.5;\n";
		op << "	arr[ui_two]   = ${VAR_TYPE}(coords) * 0.25;\n";
		op << "	arr[ui_three] = ${VAR_TYPE}(coords) * 0.125;\n";
	}
	else if (writeAccess == INDEXACCESS_STATIC_LOOP)
	{
		op << "	for (int i = 0; i < 4; i++)\n";
		op << "	{\n";
		op << "		arr[i] = ${VAR_TYPE}(coords);\n";
		op << "		coords = coords * 0.5;\n";
		op << "	}\n";
	}
	else
	{
		DE_ASSERT(writeAccess == INDEXACCESS_DYNAMIC_LOOP);
		op << "	for (int i = 0; i < ui_four; i++)\n";
		op << "	{\n";
		op << "		arr[i] = ${VAR_TYPE}(coords);\n";
		op << "		coords = coords * 0.5;\n";
		op << "	}\n";
	}

	// Read array.
	op << "	${PRECISION} ${VAR_TYPE} res = ${VAR_TYPE}(0.0);\n";
	if (readAccess == INDEXACCESS_STATIC)
	{
		op << "	res += arr[0];\n";
		op << "	res += arr[1];\n";
		op << "	res += arr[2];\n";
		op << "	res += arr[3];\n";
	}
	else if (readAccess == INDEXACCESS_DYNAMIC)
	{
		op << "	res += arr[ui_zero];\n";
		op << "	res += arr[ui_one];\n";
		op << "	res += arr[ui_two];\n";
		op << "	res += arr[ui_three];\n";
	}
	else if (readAccess == INDEXACCESS_STATIC_LOOP)
	{
		op << "	for (int i = 0; i < 4; i++)\n";
		op << "		res += arr[i];\n";
	}
	else
	{
		DE_ASSERT(readAccess == INDEXACCESS_DYNAMIC_LOOP);
		op << "	for (int i = 0; i < ui_four; i++)\n";
		op << "		res += arr[i];\n";
	}

	if (isVertexCase)
	{
		vtx << "	v_color = vec4(res${PADDING});\n";
		frag << "	o_color = v_color;\n";
	}
	else
	{
		vtx << "	v_coords = a_coords;\n";
		frag << "	o_color = vec4(res${PADDING});\n";
	}

	vtx << "}\n";
	frag << "}\n";

	// Fill in shader templates.
	map<string, string> params;
	params.insert(pair<string, string>("VAR_TYPE", getDataTypeName(varType)));
	params.insert(pair<string, string>("ARRAY_LEN", "4"));
	params.insert(pair<string, string>("PRECISION", "mediump"));

	if (varType == TYPE_FLOAT)
		params.insert(pair<string, string>("PADDING", ", 0.0, 0.0, 1.0"));
	else if (varType == TYPE_FLOAT_VEC2)
		params.insert(pair<string, string>("PADDING", ", 0.0, 1.0"));
	else if (varType == TYPE_FLOAT_VEC3)
		params.insert(pair<string, string>("PADDING", ", 1.0"));
	else
		params.insert(pair<string, string>("PADDING", ""));

	StringTemplate vertTemplate(vtx.str());
	StringTemplate fragTemplate(frag.str());
	string vertexShaderSource = vertTemplate.specialize(params);
	string fragmentShaderSource = fragTemplate.specialize(params);

	ShaderEvalFunc evalFunc = getArrayCoordsEvalFunc(varType);
	return de::MovePtr<ShaderIndexingCase>(new ShaderIndexingCase(context, caseName, description, isVertexCase, evalFunc, vertexShaderSource, fragmentShaderSource, varType, false));
}